

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05-channels.cpp
# Opt level: O2

int main(void)

{
  Slacking *pSVar1;
  ostream *poVar2;
  pointer pCVar3;
  vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *__range1;
  vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> channels;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_270;
  string channel_id;
  string mytoken;
  ifstream infile;
  
  mytoken._M_dataplus._M_p = (pointer)&mytoken.field_2;
  mytoken._M_string_length = 0;
  mytoken.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile,"token.txt",_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&infile,(string *)&mytoken);
  slack::_detail::create(&mytoken,true);
  pSVar1 = slack::_detail::instance();
  slack::_detail::CategoryConversations::list_abi_cxx11_
            ((CategoryConversations *)&channel_id,(bool)((char)pSVar1 + -0x10));
  poVar2 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&channel_id);
  std::endl<char,std::char_traits<char>>(poVar2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&channel_id);
  pSVar1 = slack::_detail::instance();
  slack::_detail::CategoryConversations::list_magic(&channels,&pSVar1->conversations,false);
  poVar2 = slack::_detail::operator<<((ostream *)&std::cout,&channels);
  std::operator<<(poVar2,'\n');
  for (pCVar3 = channels.
                super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar3 != channels.
                super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar3 = pCVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&pCVar3->name);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string
            ((string *)&channel_id,
             (string *)
             channels.
             super__Vector_base<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pSVar1 = slack::_detail::instance();
  slack::_detail::CategoryConversations::info
            ((CategoryConversations *)&local_270,(string *)&pSVar1->conversations);
  poVar2 = nlohmann::operator<<((ostream *)&std::cout,&local_270);
  std::endl<char,std::char_traits<char>>(poVar2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_270);
  std::__cxx11::string::~string((string *)&channel_id);
  std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::~vector(&channels)
  ;
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&mytoken);
  return 0;
}

Assistant:

int main() {
    // Load the token from a file. You can also specify directly the token in your code as a string.
    std::string mytoken;
    std::ifstream infile("token.txt");
    std::getline(infile, mytoken);

    slack::create(mytoken);
    
    // You can display all the JSON response
    std::cout << slack::instance().conversations.list() << std::endl; 

    // You can display filtered informations
    auto channels = slack::conversations().list_magic();
    std::cout << channels << '\n';

    // Iterate on channels
    for (auto const& channel : channels) {
        std::cout << channel.name << std::endl;
    }

    // Get precise informations on a specific channel
    auto channel_id = channels[0].id;
    std::cout << slack::conversations().info(channel_id) << std::endl;
}